

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  string input;
  string local_a8;
  Pyraminx myPyraminx;
  
  Pyraminx::Pyraminx(&myPyraminx);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  puts(
      "Enter a command of the form AX[`] where L is the letter corresponding with a \ncorner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \nlayer of the row relative to the tip (layer 0) at the corner given, and the \noptional ` mark indicates whether the layer should be turned counterclockwise.\nThe default rotation is clockwise. The corner characters are case insensitive.\nThere should be no spaces in your command.\nEnter \'s\' to scramble, \'q\' to quit."
      );
  Pyraminx::print(&myPyraminx);
  do {
    do {
      printf("Enter command: ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&input);
    } while (input._M_string_length == 0);
    cVar1 = *input._M_dataplus._M_p;
    if ((cVar1 == 'S') || (cVar1 == 's')) {
      Pyraminx::scramble(&myPyraminx,0x14);
    }
    else {
      if ((cVar1 == 'Q') || (cVar1 == 'q')) {
        std::__cxx11::string::~string((string *)&input);
        Pyraminx::~Pyraminx(&myPyraminx);
        return 0;
      }
      std::__cxx11::string::string((string *)&local_a8,(string *)&input);
      input_to_turn(&myPyraminx,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    putchar(10);
    Pyraminx::print(&myPyraminx);
    uVar3 = Pyraminx::get_heuristic(&myPyraminx);
    printf("H: %i\n",(ulong)uVar3);
    bVar2 = Pyraminx::is_solved(&myPyraminx);
    if (bVar2) {
      puts("Solved!");
    }
  } while( true );
}

Assistant:

int main(){
    Pyraminx myPyraminx;
    std::string input;
    bool quit = false;
    printf("Enter a command of the form AX[`] where L is the letter corresponding with a \n"
           "corner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \n"
           "layer of the row relative to the tip (layer 0) at the corner given, and the \n"
           "optional ` mark indicates whether the layer should be turned counterclockwise.\n"
           "The default rotation is clockwise. The corner characters are case insensitive.\n"
           "There should be no spaces in your command.\n"
           "Enter 's' to scramble, 'q' to quit.\n");
    myPyraminx.print();
    while(!quit){
        printf("Enter command: ");
        std::getline (std::cin, input);
        if(!input.empty()){
            if(input[0] == 'q' || input[0] == 'Q'){
                quit = true;
                continue;
            }
            else if(input[0] == 's' || input[0] == 'S'){
                myPyraminx.scramble(20);
            }
            else{
                input_to_turn(myPyraminx, input);
            }
            printf("\n");
            myPyraminx.print();
            printf("H: %i\n", myPyraminx.get_heuristic());
            if(myPyraminx.is_solved()){
                printf("Solved!\n");
            }
        } //if not empty
    }// while
}